

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIFileOpenDialog.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIFileOpenDialog::sendCancelEvent(CGUIFileOpenDialog *this)

{
  long in_RDI;
  SEvent event;
  undefined4 local_40 [4];
  undefined8 local_30;
  undefined4 local_28;
  
  local_40[0] = 0;
  local_30 = 0;
  local_28 = 0xd;
  (**(code **)(**(long **)(in_RDI + 0x20) + 0x10))(*(long **)(in_RDI + 0x20),local_40);
  return;
}

Assistant:

void CGUIFileOpenDialog::sendCancelEvent()
{
	SEvent event;
	event.EventType = EET_GUI_EVENT;
	event.GUIEvent.Caller = this;
	event.GUIEvent.Element = 0;
	event.GUIEvent.EventType = EGET_FILE_CHOOSE_DIALOG_CANCELLED;
	Parent->OnEvent(event);
}